

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O3

void __thiscall QWizard::done(QWizard *this,int result)

{
  char cVar1;
  
  if (result == 0) {
    QWizardPrivate::reset(*(QWizardPrivate **)&(this->super_QDialog).super_QWidget.field_0x8);
  }
  else {
    cVar1 = (**(code **)(*(long *)&(this->super_QDialog).super_QWidget + 0x1c8))(this);
    if (cVar1 == '\0') {
      return;
    }
  }
  QDialog::done(&this->super_QDialog,result);
  return;
}

Assistant:

void QWizard::done(int result)
{
    Q_D(QWizard);
    // canceling leaves the wizard in a known state
    if (result == Rejected) {
        d->reset();
    } else {
        if (!validateCurrentPage())
            return;
    }
    QDialog::done(result);
}